

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_sqrt(secp256k1_fe *r,secp256k1_fe *a)

{
  int j;
  secp256k1_fe t1;
  secp256k1_fe x223;
  secp256k1_fe x220;
  secp256k1_fe x176;
  secp256k1_fe x88;
  secp256k1_fe x44;
  secp256k1_fe x22;
  secp256k1_fe x11;
  secp256k1_fe x9;
  secp256k1_fe x6;
  secp256k1_fe x3;
  secp256k1_fe x2;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  int iVar1;
  secp256k1_fe *in_stack_fffffffffffffe10;
  secp256k1_fe *in_stack_fffffffffffffe28;
  secp256k1_fe *in_stack_fffffffffffffe30;
  undefined1 local_1c8 [40];
  undefined1 local_1a0 [40];
  undefined1 local_178 [40];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  undefined1 local_100 [40];
  undefined1 local_d8 [40];
  undefined1 local_b0 [40];
  undefined1 local_88 [40];
  undefined1 local_60 [96];
  
  secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x1287c4);
  secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x1287f1);
  memcpy(local_88,local_60,0x28);
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x12884f);
  memcpy(local_b0,local_88,0x28);
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x1288ad);
  memcpy(local_d8,local_b0,0x28);
  for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x12890b);
  memcpy(local_100,local_d8,0x28);
  for (iVar1 = 0; iVar1 < 0xb; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x128969);
  memcpy(local_128,local_100,0x28);
  for (iVar1 = 0; iVar1 < 0x16; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x1289c7);
  memcpy(local_150,local_128,0x28);
  for (iVar1 = 0; iVar1 < 0x2c; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x128a25);
  memcpy(local_178,local_150,0x28);
  for (iVar1 = 0; iVar1 < 0x58; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x128a83);
  memcpy(local_1a0,local_178,0x28);
  for (iVar1 = 0; iVar1 < 0x2c; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x128ad8);
  memcpy(local_1c8,local_1a0,0x28);
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x128b2a);
  memcpy(&stack0xfffffffffffffe10,local_1c8,0x28);
  for (iVar1 = 0; iVar1 < 0x17; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x128b7c);
  for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
    secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  }
  secp256k1_fe_mul(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08),
                   (secp256k1_fe *)0x128bba);
  secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  secp256k1_fe_sqr(in_stack_fffffffffffffe10,
                   (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe08));
  iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  return iVar1;
}

Assistant:

static int secp256k1_fe_sqrt(secp256k1_fe *r, const secp256k1_fe *a) {
    /** Given that p is congruent to 3 mod 4, we can compute the square root of
     *  a mod p as the (p+1)/4'th power of a.
     *
     *  As (p+1)/4 is an even number, it will have the same result for a and for
     *  (-a). Only one of these two numbers actually has a square root however,
     *  so we test at the end by squaring and comparing to the input.
     *  Also because (p+1)/4 is an even number, the computed square root is
     *  itself always a square (a ** ((p+1)/4) is the square of a ** ((p+1)/8)).
     */
    secp256k1_fe x2, x3, x6, x9, x11, x22, x44, x88, x176, x220, x223, t1;
    int j;

    /** The binary representation of (p + 1)/4 has 3 blocks of 1s, with lengths in
     *  { 2, 22, 223 }. Use an addition chain to calculate 2^n - 1 for each block:
     *  1, [2], 3, 6, 9, 11, [22], 44, 88, 176, 220, [223]
     */

    secp256k1_fe_sqr(&x2, a);
    secp256k1_fe_mul(&x2, &x2, a);

    secp256k1_fe_sqr(&x3, &x2);
    secp256k1_fe_mul(&x3, &x3, a);

    x6 = x3;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x6, &x6);
    }
    secp256k1_fe_mul(&x6, &x6, &x3);

    x9 = x6;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x9, &x9);
    }
    secp256k1_fe_mul(&x9, &x9, &x3);

    x11 = x9;
    for (j=0; j<2; j++) {
        secp256k1_fe_sqr(&x11, &x11);
    }
    secp256k1_fe_mul(&x11, &x11, &x2);

    x22 = x11;
    for (j=0; j<11; j++) {
        secp256k1_fe_sqr(&x22, &x22);
    }
    secp256k1_fe_mul(&x22, &x22, &x11);

    x44 = x22;
    for (j=0; j<22; j++) {
        secp256k1_fe_sqr(&x44, &x44);
    }
    secp256k1_fe_mul(&x44, &x44, &x22);

    x88 = x44;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x88, &x88);
    }
    secp256k1_fe_mul(&x88, &x88, &x44);

    x176 = x88;
    for (j=0; j<88; j++) {
        secp256k1_fe_sqr(&x176, &x176);
    }
    secp256k1_fe_mul(&x176, &x176, &x88);

    x220 = x176;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x220, &x220);
    }
    secp256k1_fe_mul(&x220, &x220, &x44);

    x223 = x220;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x223, &x223);
    }
    secp256k1_fe_mul(&x223, &x223, &x3);

    /* The final result is then assembled using a sliding window over the blocks. */

    t1 = x223;
    for (j=0; j<23; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x22);
    for (j=0; j<6; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x2);
    secp256k1_fe_sqr(&t1, &t1);
    secp256k1_fe_sqr(r, &t1);

    /* Check that a square root was actually calculated */

    secp256k1_fe_sqr(&t1, r);
    return secp256k1_fe_equal(&t1, a);
}